

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer-source-line-finder.cc
# Opt level: O0

Result __thiscall
wabt::LexerSourceLineFinder::GetLineOffsets
          (LexerSourceLineFinder *this,int find_line,OffsetRange *out_range)

{
  long lVar1;
  bool bVar2;
  Result result;
  int iVar3;
  pointer pLVar4;
  char *pcVar5;
  size_type sVar6;
  undefined4 extraout_var;
  reference pcVar7;
  difference_type dVar8;
  OffsetRange OVar9;
  byte local_d1;
  unsigned_long local_c0;
  unsigned_long uStack_b8;
  unsigned_long local_b0;
  Offset end_1;
  unsigned_long local_a0;
  Offset line_offset;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> end;
  iterator iter;
  size_t read_size;
  long local_78;
  Offset buffer_file_offset;
  allocator_type local_59;
  undefined1 local_58 [8];
  vector<char,_std::allocator<char>_> buffer;
  size_t kBufferSize;
  unsigned_long local_30;
  OffsetRange *out_range_local;
  int find_line_local;
  LexerSourceLineFinder *this_local;
  ulong __n;
  
  bVar2 = IsLineCached(this,find_line);
  if (bVar2) {
    OVar9 = GetCachedLine(this,find_line);
    kBufferSize = OVar9.start;
    out_range->start = kBufferSize;
    local_30 = OVar9.end;
    out_range->end = local_30;
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  else {
    buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ = 0x10000;
    std::allocator<char>::allocator();
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)local_58,0x10000,&local_59);
    std::allocator<char>::~allocator(&local_59);
    bVar2 = std::vector<wabt::Range<unsigned_long>,_std::allocator<wabt::Range<unsigned_long>_>_>::
            empty(&this->line_ranges_);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      __assert_fail("!line_ranges_.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/lexer-source-line-finder.cc"
                    ,0x58,"Result wabt::LexerSourceLineFinder::GetLineOffsets(int, OffsetRange *)");
    }
    local_78 = 0;
    while( true ) {
      bVar2 = IsLineCached(this,find_line);
      local_d1 = 0;
      if (!bVar2) {
        local_d1 = this->eof_ ^ 0xff;
      }
      if ((local_d1 & 1) == 0) {
        bVar2 = IsLineCached(this,find_line);
        if (bVar2) {
          OVar9 = GetCachedLine(this,find_line);
          local_c0 = OVar9.start;
          uStack_b8 = OVar9.end;
          out_range->start = local_c0;
          out_range->end = uStack_b8;
          Result::Result((Result *)((long)&this_local + 4),Ok);
        }
        else {
          if ((this->eof_ & 1U) == 0) {
            __assert_fail("eof_",
                          "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/lexer-source-line-finder.cc"
                          ,0x78,
                          "Result wabt::LexerSourceLineFinder::GetLineOffsets(int, OffsetRange *)");
          }
          Result::Result((Result *)((long)&this_local + 4),Error);
        }
        goto LAB_016b39b2;
      }
      pLVar4 = std::unique_ptr<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_>::
               operator->(&this->source_);
      result.enum_ = (*pLVar4->_vptr_LexerSource[3])(pLVar4,&local_78);
      bVar2 = Failed(result);
      if (bVar2) break;
      pLVar4 = std::unique_ptr<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_>::
               operator->(&this->source_);
      pcVar5 = std::vector<char,_std::allocator<char>_>::data
                         ((vector<char,_std::allocator<char>_> *)local_58);
      sVar6 = std::vector<char,_std::allocator<char>_>::size
                        ((vector<char,_std::allocator<char>_> *)local_58);
      iVar3 = (*pLVar4->_vptr_LexerSource[4])(pLVar4,pcVar5,sVar6);
      __n = CONCAT44(extraout_var,iVar3);
      sVar6 = std::vector<char,_std::allocator<char>_>::size
                        ((vector<char,_std::allocator<char>_> *)local_58);
      if (__n < sVar6) {
        this->eof_ = true;
      }
      end._M_current =
           (char *)std::vector<char,_std::allocator<char>_>::begin
                             ((vector<char,_std::allocator<char>_> *)local_58);
      line_offset = (Offset)__gnu_cxx::
                            __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
                            operator+(&end,__n);
      while (bVar2 = __gnu_cxx::operator<
                               (&end,(__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>
                                      *)&line_offset), bVar2) {
        pcVar7 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
                 operator*(&end);
        lVar1 = local_78;
        if (*pcVar7 == '\n') {
          end_1 = (Offset)std::vector<char,_std::allocator<char>_>::begin
                                    ((vector<char,_std::allocator<char>_> *)local_58);
          dVar8 = __gnu_cxx::operator-
                            (&end,(__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>
                                   *)&end_1);
          local_a0 = (lVar1 + dVar8) - (ulong)(this->last_cr_ & 1);
          std::vector<wabt::Range<unsigned_long>,std::allocator<wabt::Range<unsigned_long>>>::
          emplace_back<unsigned_long&,unsigned_long&>
                    ((vector<wabt::Range<unsigned_long>,std::allocator<wabt::Range<unsigned_long>>>
                      *)&this->line_ranges_,&this->next_line_start_,&local_a0);
          this->next_line_start_ = local_a0 + (this->last_cr_ & 1) + 1;
        }
        pcVar7 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
                 operator*(&end);
        this->last_cr_ = *pcVar7 == '\r';
        __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::operator++
                  (&end);
      }
      if ((this->eof_ & 1U) != 0) {
        local_b0 = local_78 + __n;
        std::vector<wabt::Range<unsigned_long>,std::allocator<wabt::Range<unsigned_long>>>::
        emplace_back<unsigned_long&,unsigned_long&>
                  ((vector<wabt::Range<unsigned_long>,std::allocator<wabt::Range<unsigned_long>>> *)
                   &this->line_ranges_,&this->next_line_start_,&local_b0);
      }
    }
    Result::Result((Result *)((long)&this_local + 4),Error);
LAB_016b39b2:
    std::vector<char,_std::allocator<char>_>::~vector
              ((vector<char,_std::allocator<char>_> *)local_58);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result LexerSourceLineFinder::GetLineOffsets(int find_line,
                                             OffsetRange* out_range) {
  if (IsLineCached(find_line)) {
    *out_range = GetCachedLine(find_line);
    return Result::Ok;
  }

  const size_t kBufferSize = 1 << 16;
  std::vector<char> buffer(kBufferSize);

  assert(!line_ranges_.empty());
  Offset buffer_file_offset = 0;
  while (!IsLineCached(find_line) && !eof_) {
    CHECK_RESULT(source_->Tell(&buffer_file_offset));
    size_t read_size = source_->Fill(buffer.data(), buffer.size());
    if (read_size < buffer.size()) {
      eof_ = true;
    }

    for (auto iter = buffer.begin(), end = iter + read_size; iter < end;
         ++iter) {
      if (*iter == '\n') {
        // Don't include \n or \r in the line range.
        Offset line_offset =
            buffer_file_offset + (iter - buffer.begin()) - last_cr_;
        line_ranges_.emplace_back(next_line_start_, line_offset);
        next_line_start_ = line_offset + last_cr_ + 1;
      }
      last_cr_ = *iter == '\r';
    }

    if (eof_) {
      // Add the final line as an empty range.
      Offset end = buffer_file_offset + read_size;
      line_ranges_.emplace_back(next_line_start_, end);
    }
  }

  if (IsLineCached(find_line)) {
    *out_range = GetCachedLine(find_line);
    return Result::Ok;
  } else {
    assert(eof_);
    return Result::Error;
  }
}